

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O2

void __thiscall MainWindow::onFileNew(MainWindow *this)

{
  bool bVar1;
  
  bVar1 = maybeSave(this);
  if (bVar1) {
    Renderer::forceStop(this->mRenderer);
    Module::clear(this->mModule);
    ModuleFile::setName(&this->mModuleFile,&this->mUntitledString);
    ModuleFile::clearFilepath(&this->mModuleFile);
    updateWindowTitle(this);
    return;
  }
  return;
}

Assistant:

void MainWindow::onFileNew() {
    if (!maybeSave()) {
        return;
    }

    mRenderer->forceStop();

    mModule->clear();

    mModuleFile.setName(mUntitledString);
    mModuleFile.clearFilepath();
    updateWindowTitle();

}